

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
 __thiscall ninx::parser::Parser::parse_value(Parser *this)

{
  pointer pcVar1;
  int iVar2;
  Variable *this_00;
  string *psVar3;
  _Alloc_hider this_01;
  Token *pTVar4;
  ParserException *pPVar5;
  string *in_RSI;
  string name;
  _Alloc_hider local_50;
  undefined8 local_40;
  
  psVar3 = in_RSI + 1;
  iVar2 = TokenReader::check_limiter((TokenReader *)psVar3,'{');
  if (iVar2 == 1) {
    parse_block((Parser *)&stack0xffffffffffffffb0);
    this_01._M_p = local_50._M_p;
  }
  else {
    iVar2 = TokenReader::check_limiter((TokenReader *)psVar3,'(');
    if (iVar2 != 1) {
      pTVar4 = TokenReader::peek_token((TokenReader *)psVar3);
      if (pTVar4 != (Token *)0x0) {
        pTVar4 = TokenReader::peek_token((TokenReader *)psVar3);
        iVar2 = (*pTVar4->_vptr_Token[2])(pTVar4);
        if (iVar2 == 3) {
          pTVar4 = TokenReader::get_token((TokenReader *)psVar3);
          this_00 = (Variable *)
                    __dynamic_cast(pTVar4,&lexer::token::Token::typeinfo,
                                   &lexer::token::Variable::typeinfo,0);
          psVar3 = lexer::token::Variable::get_name_abi_cxx11_(this_00);
          pcVar1 = (psVar3->_M_dataplus)._M_p;
          local_50._M_p = (pointer)&stack0xffffffffffffffc0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&stack0xffffffffffffffb0,pcVar1,pcVar1 + psVar3->_M_string_length);
          iVar2 = lexer::token::Variable::get_trailing_spaces(this_00);
          this_01._M_p = (pointer)operator_new(0x40);
          element::VariableRead::VariableRead
                    ((VariableRead *)this_01._M_p,(string *)&stack0xffffffffffffffb0,iVar2);
          if (local_50._M_p != (pointer)&stack0xffffffffffffffc0) {
            operator_delete(local_50._M_p,local_40 + 1);
          }
          goto LAB_00124178;
        }
      }
      pTVar4 = TokenReader::get_token((TokenReader *)psVar3);
      pPVar5 = (ParserException *)__cxa_allocate_exception(0x20);
      local_50._M_p = (pointer)&stack0xffffffffffffffc0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xffffffffffffffb0,"Expected Block or Variable.","");
      exception::ParserException::ParserException
                (pPVar5,pTVar4,in_RSI,(string *)&stack0xffffffffffffffb0);
      __cxa_throw(pPVar5,&exception::ParserException::typeinfo,std::runtime_error::~runtime_error);
    }
    TokenReader::get_token((TokenReader *)psVar3);
    parse_level_3_expression((Parser *)&stack0xffffffffffffffb0);
    iVar2 = TokenReader::check_limiter((TokenReader *)psVar3,')');
    if (iVar2 != 1) {
      pTVar4 = TokenReader::get_token((TokenReader *)psVar3);
      pPVar5 = (ParserException *)__cxa_allocate_exception(0x20);
      local_50._M_p = (pointer)&stack0xffffffffffffffc0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xffffffffffffffb0,"Expected closing parethesis \')\'","");
      exception::ParserException::ParserException
                (pPVar5,pTVar4,in_RSI,(string *)&stack0xffffffffffffffb0);
      __cxa_throw(pPVar5,&exception::ParserException::typeinfo,std::runtime_error::~runtime_error);
    }
    TokenReader::get_token((TokenReader *)psVar3);
    this_01._M_p = local_50._M_p;
  }
LAB_00124178:
  (this->origin)._M_dataplus._M_p = this_01._M_p;
  return (__uniq_ptr_data<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>,_true,_true>
          )(__uniq_ptr_data<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Expression> ninx::parser::Parser::parse_value() {
    std::unique_ptr<Expression> value{nullptr};

    // Check if is a block value or a variable read
    if (reader.check_limiter('{') == 1) {
        value = parse_block();
    } else if (reader.check_limiter('(') == 1) {  // Nested expression
        // Consume the open parenthesis
        reader.get_token();

        value = parse_expression();

        // Check and consume the closing parenthesis
        if (reader.check_limiter(')') != 1) {
            auto error_token{reader.get_token()};
            throw ParserException(error_token, this->origin, "Expected closing parethesis ')'");
        }
        reader.get_token();

    } else if (reader.peek_token() != nullptr && reader.peek_token()->get_type() == Type::VARIABLE) {
        // Get the variable name
        auto variable_token {dynamic_cast<ninx::lexer::token::Variable *>(reader.get_token())};
        auto name{variable_token->get_name()};
        value = std::make_unique<ninx::parser::element::VariableRead>(name, variable_token->get_trailing_spaces());
    } else {
        auto error_token{reader.get_token()};
        throw ParserException(error_token, this->origin, "Expected Block or Variable.");
    }

    return std::move(value);
}